

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,3ul>::operator*=
          (Matrix_Dense<double,2ul,3ul> *this,Matrix_Dense<double,_2UL,_3UL> *matrix)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  array<double,_3UL> *paVar6;
  reference pvVar7;
  const_reference pvVar8;
  source_location *in_RCX;
  ulong local_238;
  size_t i_column;
  size_t i_row_other;
  size_t i_row;
  matrix_type copy;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pair<unsigned_long,_unsigned_long> local_38;
  pair<unsigned_long,_unsigned_long> local_28;
  array<Disa::Vector_Dense<double,_3UL>,_2UL> *local_18;
  Matrix_Dense<double,_2UL,_3UL> *matrix_local;
  Matrix_Dense<double,_2UL,_3UL> *this_local;
  
  local_18 = &matrix->super_array<Disa::Vector_Dense<double,_3UL>,_2UL>;
  matrix_local = (Matrix_Dense<double,_2UL,_3UL> *)this;
  local_28 = Matrix_Dense<double,_2UL,_3UL>::size((Matrix_Dense<double,_2UL,_3UL> *)this);
  local_38 = Matrix_Dense<double,_2UL,_3UL>::size((Matrix_Dense<double,_2UL,_3UL> *)local_18);
  bVar3 = std::operator==(&local_28,&local_38);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    Matrix_Dense<double,_2UL,_3UL>::Matrix_Dense((Matrix_Dense<double,_2UL,_3UL> *)&i_row);
    std::swap<Disa::Matrix_Dense<double,2ul,3ul>>
              ((Matrix_Dense<double,_2UL,_3UL> *)this,(Matrix_Dense<double,_2UL,_3UL> *)&i_row);
    i_row_other = 0;
    while( true ) {
      sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_row((Matrix_Dense<double,_2UL,_3UL> *)this);
      if (sVar5 <= i_row_other) break;
      i_column = 0;
      while( true ) {
        sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_row((Matrix_Dense<double,_2UL,_3UL> *)local_18)
        ;
        if (sVar5 <= i_column) break;
        local_238 = 0;
        while( true ) {
          sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_column
                            ((Matrix_Dense<double,_2UL,_3UL> *)this);
          if (sVar5 <= local_238) break;
          if (i_column == 0) {
            paVar6 = &std::array<Disa::Vector_Dense<double,_3UL>,_2UL>::operator[]
                                ((array<Disa::Vector_Dense<double,_3UL>,_2UL> *)this,i_row_other)->
                      super_array<double,_3UL>;
            pvVar7 = std::array<double,_3UL>::operator[](paVar6,local_238);
            *pvVar7 = 0.0;
          }
          paVar6 = &std::array<Disa::Vector_Dense<double,_3UL>,_2UL>::operator[]
                              ((array<Disa::Vector_Dense<double,_3UL>,_2UL> *)&i_row,i_row_other)->
                    super_array<double,_3UL>;
          pvVar7 = std::array<double,_3UL>::operator[](paVar6,i_column);
          dVar1 = *pvVar7;
          paVar6 = &std::array<Disa::Vector_Dense<double,_3UL>,_2UL>::operator[](local_18,i_column)
                    ->super_array<double,_3UL>;
          pvVar8 = std::array<double,_3UL>::operator[](paVar6,local_238);
          dVar2 = *pvVar8;
          paVar6 = &std::array<Disa::Vector_Dense<double,_3UL>,_2UL>::operator[]
                              ((array<Disa::Vector_Dense<double,_3UL>,_2UL> *)this,i_row_other)->
                    super_array<double,_3UL>;
          pvVar7 = std::array<double,_3UL>::operator[](paVar6,local_238);
          *pvVar7 = dVar1 * dVar2 + *pvVar7;
          local_238 = local_238 + 1;
        }
        i_column = i_column + 1;
      }
      i_row_other = i_row_other + 1;
    }
    return (matrix_type *)this;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"\n");
  local_60 = &PTR_s__workspace_llm4binary_github_lic_001ee320;
  console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,in_RCX);
  poVar4 = std::operator<<(poVar4,(string *)&local_58);
  sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_row((Matrix_Dense<double,_2UL,_3UL> *)this);
  std::__cxx11::to_string(&local_190,sVar5);
  std::operator+(&local_170,"Incompatible matrix dimensions, ",&local_190);
  std::operator+(&local_150,&local_170,",");
  sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_column((Matrix_Dense<double,_2UL,_3UL> *)this);
  std::__cxx11::to_string(&local_1b0,sVar5);
  std::operator+(&local_130,&local_150,&local_1b0);
  std::operator+(&local_110,&local_130," vs. ");
  sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_row((Matrix_Dense<double,_2UL,_3UL> *)local_18);
  std::__cxx11::to_string(&local_1d0,sVar5);
  std::operator+(&local_f0,&local_110,&local_1d0);
  std::operator+(&local_d0,&local_f0,",");
  sVar5 = Matrix_Dense<double,_2UL,_3UL>::size_column((Matrix_Dense<double,_2UL,_3UL> *)local_18);
  std::__cxx11::to_string
            ((string *)
             (copy.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
              super_array<double,_3UL>._M_elems + 2),sVar5);
  std::operator+(&local_b0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (copy.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
                  super_array<double,_3UL>._M_elems + 2));
  std::operator+(&local_90,&local_b0,".");
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string
            ((string *)
             (copy.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
              super_array<double,_3UL>._M_elems + 2));
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

constexpr matrix_type& operator*=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    // For static containers the matrices must be square.
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    matrix_type copy;
    std::swap(*this, copy);
    FOR(i_row, size_row()) {
      FOR(i_row_other, matrix.size_row()) {
        FOR(i_column, size_column()) {
          if(i_row_other == 0) (*this)[i_row][i_column] = 0.0;
          (*this)[i_row][i_column] += copy[i_row][i_row_other] * matrix[i_row_other][i_column];
        }
      }
    }
    return *this;
  }